

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

char * gguf_get_arr_str(gguf_context *ctx,int64_t key_id,size_t i)

{
  pointer pgVar1;
  char *pcVar2;
  int line;
  
  if (-1 < key_id) {
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key_id < ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pgVar1) / 0x58) {
      if (pgVar1[key_id].type == GGUF_TYPE_STRING) {
        return *(char **)(*(long *)&pgVar1[key_id].data_string.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data + i * 0x20);
      }
      pcVar2 = "ctx->kv[key_id].get_type() == GGUF_TYPE_STRING";
      line = 0x312;
      goto LAB_0013f44a;
    }
  }
  pcVar2 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
  line = 0x311;
LAB_0013f44a:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

const char * gguf_get_arr_str(const struct gguf_context * ctx, int64_t key_id, size_t i) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_type() == GGUF_TYPE_STRING);
    return ctx->kv[key_id].data_string[i].c_str();
}